

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rasterization_conservative_state
          (Impl *this,Value *state,VkPipelineRasterizationConservativeStateCreateInfoEXT **out_info)

{
  uint uVar1;
  VkConservativeRasterizationModeEXT VVar2;
  VkPipelineRasterizationConservativeStateCreateInfoEXT *pVVar3;
  Type pGVar4;
  float fVar5;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkPipelineRasterizationConservativeStateCreateInfoEXT>
                     (&this->allocator);
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"flags");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->flags = uVar1;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"conservativeRasterizationMode");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->conservativeRasterizationMode = VVar2;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"extraPrimitiveOverestimationSize");
  fVar5 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetFloat(pGVar4);
  pVVar3->extraPrimitiveOverestimationSize = fVar5;
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_rasterization_conservative_state(const Value &state,
                                                                 VkPipelineRasterizationConservativeStateCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineRasterizationConservativeStateCreateInfoEXT>();

	info->flags = state["flags"].GetUint();
	info->conservativeRasterizationMode = static_cast<VkConservativeRasterizationModeEXT>(state["conservativeRasterizationMode"].GetUint());
	info->extraPrimitiveOverestimationSize = state["extraPrimitiveOverestimationSize"].GetFloat();

	*out_info = info;
	return true;
}